

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

int32_t ucal_getAttribute_63(UCalendar *cal,UCalendarAttribute attr)

{
  UBool UVar1;
  byte bVar2;
  UCalendarAttribute attr_local;
  UCalendar *cal_local;
  
  switch(attr) {
  case UCAL_LENIENT:
    UVar1 = icu_63::Calendar::isLenient((Calendar *)cal);
    cal_local._4_4_ = (UCalendarWallTimeOption)UVar1;
    break;
  case UCAL_FIRST_DAY_OF_WEEK:
    cal_local._4_4_ = icu_63::Calendar::getFirstDayOfWeek((Calendar *)cal);
    break;
  case UCAL_MINIMAL_DAYS_IN_FIRST_WEEK:
    bVar2 = icu_63::Calendar::getMinimalDaysInFirstWeek((Calendar *)cal);
    cal_local._4_4_ = (UCalendarWallTimeOption)bVar2;
    break;
  case UCAL_REPEATED_WALL_TIME:
    cal_local._4_4_ = icu_63::Calendar::getRepeatedWallTimeOption((Calendar *)cal);
    break;
  case UCAL_SKIPPED_WALL_TIME:
    cal_local._4_4_ = icu_63::Calendar::getSkippedWallTimeOption((Calendar *)cal);
    break;
  default:
    cal_local._4_4_ = ~UCAL_WALLTIME_LAST;
  }
  return cal_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getAttribute(    const    UCalendar*              cal,
                  UCalendarAttribute      attr)
{

    switch(attr) {
  case UCAL_LENIENT:
      return ((Calendar*)cal)->isLenient();

  case UCAL_FIRST_DAY_OF_WEEK:
      return ((Calendar*)cal)->getFirstDayOfWeek();

  case UCAL_MINIMAL_DAYS_IN_FIRST_WEEK:
      return ((Calendar*)cal)->getMinimalDaysInFirstWeek();

  case UCAL_REPEATED_WALL_TIME:
      return ((Calendar*)cal)->getRepeatedWallTimeOption();

  case UCAL_SKIPPED_WALL_TIME:
      return ((Calendar*)cal)->getSkippedWallTimeOption();

  default:
      break;
    }
    return -1;
}